

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::BasicResourceImage::RunIteration
          (BasicResourceImage *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  RenderTarget *pRVar1;
  bool bVar2;
  GLuint GVar3;
  GLint GVar4;
  uint height;
  ostream *poVar5;
  vec4 *epsilon;
  bool *compile_error;
  int i;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint width;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ComputeShaderBase *this_01;
  uvec3 global_size;
  float local_1fc;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> display;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  tcu::operator*((tcu *)&global_size,param_1,num_groups);
  std::__cxx11::stringstream::stringstream((stringstream *)&data);
  poVar5 = std::operator<<((ostream *)
                           &data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           "\nlayout(local_size_x = ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,", local_size_y = ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,", local_size_z = ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,
                           ") in;\nlayout(rgba32f) coherent uniform image2D g_image1;\nlayout(rgba32f) uniform image2D g_image2;\nconst uvec3 kGlobalSize = uvec3("
                          );
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,
                  ");\nvoid main() {\n  if (gl_GlobalInvocationID.x >= kGlobalSize.x || gl_GlobalInvocationID.y >= kGlobalSize.y) return;\n  vec4 color = vec4(gl_GlobalInvocationID.x + gl_GlobalInvocationID.y) / 255.0;\n  imageStore(g_image1, ivec2(gl_GlobalInvocationID), color);\n  vec4 c = imageLoad(g_image1, ivec2(gl_GlobalInvocationID));\n  imageStore(g_image2, ivec2(gl_GlobalInvocationID), c);\n}"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&data);
  GVar3 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)&display)
  ;
  this->m_program = GVar3;
  std::__cxx11::string::~string((string *)&display);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar2) {
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_image1");
    glu::CallLogWrapper::glUniform1i(this_00,GVar4,0);
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_image2");
    glu::CallLogWrapper::glUniform1i(this_00,GVar4,1);
    glu::CallLogWrapper::glUseProgram(this_00,0);
    width = num_groups->m_data[0] * param_1->m_data[0];
    height = num_groups->m_data[1] * param_1->m_data[1];
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&data,(ulong)(num_groups->m_data[2] * param_1->m_data[2] * height * width),
               (allocator_type *)&display);
    textures = this->m_texture;
    if (this->m_texture[0] == 0) {
      glu::CallLogWrapper::glGenTextures(this_00,2,textures);
    }
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,textures[lVar6]);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
      glu::CallLogWrapper::glTexImage2D
                (this_00,0xde1,0,0x8814,width,height,0,0x1908,0x1406,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    }
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    glu::CallLogWrapper::glBindImageTexture(this_00,0,*textures,0,'\0',0,0x88ba,0x8814);
    glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture[1],0,'\0',0,0x88b9,0x8814);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    if (dispatch_indirect) {
      GVar3 = this->m_dispatch_buffer;
      if (GVar3 == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
        GVar3 = this->m_dispatch_buffer;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar3);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x20);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c1);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[1]);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_draw_program);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
    glu::CallLogWrapper::glViewport(this_00,0,0,width,height);
    glu::CallLogWrapper::glDrawArraysInstanced(this_00,5,0,4,1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&display,(long)(int)(height * width),(allocator_type *)&global_size);
    uVar7 = 0;
    glu::CallLogWrapper::glReadPixels
              (this_00,0,0,width,height,0x1908,0x1406,
               display.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    uVar8 = 0;
    if (0 < (int)width) {
      uVar8 = (ulong)width;
    }
    uVar11 = (ulong)height;
    if ((int)height < 1) {
      uVar11 = uVar7;
    }
    for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
      for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        pRVar1 = (this->super_ComputeShaderBase).renderTarget;
        epsilon = (vec4 *)(long)pRVar1->m_height;
        if (((long)uVar10 < (long)epsilon) && ((long)uVar9 < (long)pRVar1->m_width)) {
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)&global_size,(float)((int)uVar10 + (int)uVar9) / 255.0);
          this_01 = (ComputeShaderBase *)
                    (display.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + ((int)uVar7 + (int)uVar9));
          bVar2 = ComputeShaderBase::ColorEqual
                            (this_01,(Vector<float,_4> *)&global_size,
                             &(this->super_ComputeShaderBase).g_color_eps,epsilon);
          if (!bVar2) {
            anon_unknown_0::Output
                      ("Got %f, %f, %f, %f, expected %f, %f, %f, %f at %d, %d",
                       (double)*(float *)&(this_01->super_SubcaseBase).super_GLWrapper.
                                          _vptr_GLWrapper,
                       (double)*(float *)((long)&(this_01->super_SubcaseBase).super_GLWrapper.
                                                 _vptr_GLWrapper + 4),
                       (double)*(float *)&(this_01->super_SubcaseBase).super_GLWrapper.
                                          super_CallLogWrapper.m_gl,
                       (double)*(float *)((long)&(this_01->super_SubcaseBase).super_GLWrapper.
                                                 super_CallLogWrapper.m_gl + 4),
                       (double)(float)global_size.m_data[0],(double)(float)global_size.m_data[1],
                       (double)(float)global_size.m_data[2],(double)local_1fc,uVar9 & 0xffffffff,
                       uVar10 & 0xffffffff);
            goto LAB_009cbe41;
          }
        }
      }
      uVar7 = uVar7 + width;
    }
LAB_009cbe41:
    bVar2 = (long)(int)height <= (long)uVar10;
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&display.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_image1"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_image2"), 1);
		glUseProgram(0);

		const GLint  kWidth  = static_cast<GLint>(local_size.x() * num_groups.x());
		const GLint  kHeight = static_cast<GLint>(local_size.y() * num_groups.y());
		const GLint  kDepth  = static_cast<GLint>(local_size.z() * num_groups.z());
		const GLuint kSize   = kWidth * kHeight * kDepth;

		std::vector<vec4> data(kSize);
		if (m_texture[0] == 0)
			glGenTextures(2, m_texture);

		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, m_texture[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, kWidth, kHeight, 0, GL_RGBA, GL_FLOAT, &data[0]);
		}
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindImageTexture(0, m_texture[0], 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(1, m_texture[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		glClear(GL_COLOR_BUFFER_BIT);
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glUseProgram(m_draw_program);
		glBindVertexArray(m_vertex_array);
		glViewport(0, 0, kWidth, kHeight);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 1);

		std::vector<vec4> display(kWidth * kHeight);
		glReadPixels(0, 0, kWidth, kHeight, GL_RGBA, GL_FLOAT, &display[0]);

		for (int y = 0; y < kHeight; ++y)
		{
			for (int x = 0; x < kWidth; ++x)
			{
				if (y >= getWindowHeight() || x >= getWindowWidth())
				{
					continue;
				}
				const vec4 c = vec4(float(y + x) / 255.0f);
				if (!ColorEqual(display[y * kWidth + x], c, g_color_eps))
				{
					Output("Got %f, %f, %f, %f, expected %f, %f, %f, %f at %d, %d", display[y * kWidth + x].x(),
						   display[y * kWidth + x].y(), display[y * kWidth + x].z(), display[y * kWidth + x].w(), c.x(),
						   c.y(), c.z(), c.w(), x, y);
					return false;
				}
			}
		}

		return true;
	}